

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Option *value)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  Value *value_00;
  size_t in_RCX;
  void *__buf;
  Value *item;
  const_iterator __end3;
  const_iterator __begin3;
  ElementList *__range3;
  Option *value_local;
  BinBinaryWriter *this_local;
  
  bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
          ::is_container(value->valueType);
  if (bVar1) {
    this_local._7_1_ = fail_msg(this,"!ValueHelper::is_container(value.valueType)\n");
  }
  else {
    sVar2 = std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::size(&value->items);
    if (sVar2 < 2) {
      uVar3 = BinaryWriter::write(&this->writer,(uint)value->valueType,__buf,in_RCX);
      if ((uVar3 & 1) == 0) {
        this_local._7_1_ = fail_msg(this,"writer.write(value.valueType)\n");
      }
      else {
        sVar2 = std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::size
                          (&value->items);
        BinaryWriter::write<unsigned_char>(&this->writer,(uchar)sVar2);
        __end3 = std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::begin
                           (&value->items);
        item = (Value *)std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::end
                                  (&value->items);
        while (bVar1 = __gnu_cxx::
                       operator==<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                                 (&__end3,(__normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                                           *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
          value_00 = &__gnu_cxx::
                      __normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                      ::operator*(&__end3)->value;
          bVar1 = write_value(this,value_00,value->valueType);
          if (!bVar1) {
            bVar1 = fail_msg(this,"write_value(item, value.valueType)\n");
            return bVar1;
          }
          __gnu_cxx::
          __normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
          ::operator++(&__end3);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = fail_msg(this,"value.items.size() <= 1\n");
    }
  }
  return this_local._7_1_;
}

Assistant:

bool write_value_visit(Option const& value) noexcept {
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(value.items.size() <= 1);
            bin_assert(writer.write(value.valueType));
            writer.write(static_cast<uint8_t>(value.items.size()));
            for (auto const& [item] : value.items) {
                bin_assert(write_value(item, value.valueType));
            }
            return true;
        }